

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O1

void * malloc(size_t __size)

{
  mchunkptr pmVar1;
  mchunkptr pmVar2;
  size_t *psVar3;
  byte *pbVar4;
  malloc_tree_chunk *pmVar5;
  malloc_tree_chunk *pmVar6;
  malloc_chunk *pmVar7;
  tbinptr pmVar8;
  size_t sVar9;
  binmap_t bVar10;
  binmap_t bVar11;
  int iVar12;
  malloc_chunk *pmVar13;
  size_t dvs;
  char *pcVar14;
  ulong uVar15;
  mstate pmVar16;
  mchunkptr pmVar17;
  void *pvVar18;
  mstate m;
  mstate pmVar19;
  mchunkptr pmVar20;
  int *piVar21;
  uint uVar22;
  tbinptr pmVar23;
  ulong uVar24;
  malloc_tree_chunk **ppmVar25;
  malloc_segment *pmVar26;
  long lVar27;
  uint uVar28;
  char *oldbase;
  msegmentptr sp_1;
  malloc_chunk *pmVar29;
  malloc_chunk **ppmVar30;
  long *plVar31;
  malloc_tree_chunk *pmVar32;
  mchunkptr pmVar33;
  malloc_chunk *pmVar34;
  long lVar35;
  byte bVar36;
  ulong uVar37;
  tbinptr pmVar38;
  flag_t fVar39;
  msegmentptr sp;
  char *pcVar40;
  tbinptr pmVar41;
  char *pcVar42;
  char *pcVar43;
  bool bVar44;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  iVar12 = _gm_.mutex;
  if (((byte)_gm_.mflags & 2) != 0) {
    uVar28 = 1;
    LOCK();
    _gm_.mutex = 1;
    UNLOCK();
    if (iVar12 != 0) {
      while (_gm_.mutex != 0) {
        if ((uVar28 & 0x3f) == 0) {
          sched_yield();
        }
        uVar28 = uVar28 + 1;
      }
      LOCK();
      _gm_.mutex = 1;
      UNLOCK();
    }
  }
  sVar9 = _gm_.dvsize;
  bVar11 = _gm_.treemap;
  bVar10 = _gm_.smallmap;
  if (__size < 0xe9) {
    oldbase = &DAT_00000020;
    if (0x16 < __size) {
      oldbase = (char *)(ulong)((int)__size + 0x17U & 0x1f0);
    }
    bVar36 = (byte)((ulong)oldbase >> 3);
    uVar28 = _gm_.smallmap >> (bVar36 & 0x1f);
    if ((uVar28 & 3) != 0) {
      uVar28 = (uVar28 & 1 | (uint)((ulong)oldbase >> 3)) ^ 1;
      uVar24 = (ulong)(uVar28 << 4);
      pcVar14 = (char *)((long)_gm_.smallbins + uVar24);
      lVar35 = *(long *)((long)_gm_.smallbins + uVar24 + 0x10);
      pcVar42 = *(char **)(lVar35 + 0x10);
      if (pcVar14 == pcVar42) {
        _gm_.smallmap = _gm_.smallmap & ~(1 << (uVar28 & 0x1f));
      }
      else {
        if ((pcVar42 < _gm_.least_addr) || (*(long *)(pcVar42 + 0x18) != lVar35)) goto LAB_0010510e;
        *(char **)(pcVar42 + 0x18) = pcVar14;
        *(char **)((long)_gm_.smallbins + uVar24 + 0x10) = pcVar42;
      }
      __size = lVar35 + 0x10;
      *(ulong *)(lVar35 + 8) = (ulong)(uVar28 << 3) + 3;
      pbVar4 = (byte *)(lVar35 + 8 + (ulong)(uVar28 << 3));
      *pbVar4 = *pbVar4 | 1;
      goto LAB_00103ed7;
    }
    bVar44 = true;
    if (_gm_.dvsize < oldbase) {
      if (_gm_.smallmap >> (bVar36 & 0x1f) != 0) {
        uVar22 = 2 << (bVar36 & 0x1f);
        uVar22 = (-uVar22 | uVar22) & uVar28 << (bVar36 & 0x1f);
        uVar28 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar24 = (ulong)(uVar28 << 4);
        pcVar14 = (char *)((long)_gm_.smallbins + uVar24);
        lVar35 = *(long *)((long)_gm_.smallbins + uVar24 + 0x10);
        pcVar42 = *(char **)(lVar35 + 0x10);
        if (pcVar14 == pcVar42) {
          _gm_.smallmap = _gm_.smallmap & ~(1 << (uVar28 & 0x1f));
        }
        else {
          if ((pcVar42 < _gm_.least_addr) || (*(long *)(pcVar42 + 0x18) != lVar35))
          goto LAB_0010510e;
          *(char **)(pcVar42 + 0x18) = pcVar14;
          *(char **)((long)_gm_.smallbins + uVar24 + 0x10) = pcVar42;
        }
        __size = lVar35 + 0x10;
        uVar37 = (ulong)(uVar28 << 3);
        uVar24 = uVar37 - (long)oldbase;
        if (uVar24 < 0x20) {
          *(ulong *)(lVar35 + 8) = uVar37 | 3;
          pbVar4 = (byte *)(lVar35 + 8 + uVar37);
          *pbVar4 = *pbVar4 | 1;
        }
        else {
          *(ulong *)(lVar35 + 8) = (ulong)oldbase | 3;
          *(ulong *)(oldbase + lVar35 + 8) = uVar24 | 1;
          *(ulong *)(lVar35 + uVar37) = uVar24;
          if (sVar9 != 0) {
            uVar28 = (uint)(sVar9 >> 3);
            uVar37 = (ulong)(uVar28 * 2);
            if ((_gm_.smallmap >> (uVar28 & 0x1f) & 1) == 0) {
              _gm_.smallmap = _gm_.smallmap | 1 << ((byte)(sVar9 >> 3) & 0x1f);
              pmVar17 = (mchunkptr)(_gm_.smallbins + uVar37);
            }
            else {
              pmVar17 = _gm_.smallbins[uVar37 + 2];
              if (_gm_.smallbins[uVar37 + 2] < _gm_.least_addr) goto LAB_0010510e;
            }
            _gm_.smallbins[uVar37 + 2] = _gm_.dv;
            pmVar17->bk = _gm_.dv;
            (_gm_.dv)->fd = pmVar17;
            (_gm_.dv)->bk = (mchunkptr)(_gm_.smallbins + uVar37);
          }
          _gm_.dv = (mchunkptr)(oldbase + lVar35);
          _gm_.dvsize = uVar24;
        }
        goto LAB_00103ed7;
      }
      if (_gm_.treemap != 0) {
        uVar28 = 0;
        if (_gm_.treemap != 0) {
          for (; (_gm_.treemap >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        pmVar41 = _gm_.treebins[uVar28];
        uVar24 = (pmVar41->head & 0xfffffffffffffff8) - (long)oldbase;
        pmVar23 = pmVar41;
        while( true ) {
          pmVar32 = pmVar41->child[0];
          if (pmVar32 == (malloc_tree_chunk *)0x0) {
            pmVar32 = pmVar41->child[1];
          }
          if (pmVar32 == (malloc_tree_chunk *)0x0) break;
          uVar37 = (pmVar32->head & 0xfffffffffffffff8) - (long)oldbase;
          pmVar41 = pmVar32;
          if (uVar37 < uVar24) {
            uVar24 = uVar37;
            pmVar23 = pmVar32;
          }
        }
        if (pmVar23 < _gm_.least_addr) goto LAB_0010510e;
        pmVar32 = pmVar23->bk;
        pmVar5 = pmVar23->parent;
        if (pmVar32 == pmVar23) {
          pmVar32 = pmVar23->child[1];
          if (pmVar32 != (malloc_tree_chunk *)0x0) {
            ppmVar25 = pmVar23->child + 1;
LAB_00104904:
            do {
              if (pmVar32->child[1] == (malloc_tree_chunk *)0x0) {
                if (pmVar32->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00104918;
                ppmVar25 = pmVar32->child;
              }
              else {
                ppmVar25 = pmVar32->child + 1;
              }
              pmVar32 = *ppmVar25;
            } while( true );
          }
          pmVar32 = pmVar23->child[0];
          if (pmVar32 != (malloc_tree_chunk *)0x0) {
            ppmVar25 = pmVar23->child;
            goto LAB_00104904;
          }
          pmVar32 = (malloc_tree_chunk *)0x0;
        }
        else {
          pmVar6 = pmVar23->fd;
          if (((pmVar6 < _gm_.least_addr) || (pmVar6->bk != pmVar23)) || (pmVar32->fd != pmVar23))
          goto LAB_0010510e;
          pmVar6->bk = pmVar32;
          pmVar32->fd = pmVar6;
        }
        goto LAB_00104928;
      }
    }
    __size = 0;
    goto LAB_00104015;
  }
  oldbase = (char *)0xffffffffffffffff;
  if (__size < 0xffffffffffffff80) {
    __size = __size + 0x17;
    oldbase = (char *)(__size & 0xfffffffffffffff0);
    if (_gm_.treemap != 0) {
      uVar28 = (uint)(__size >> 8);
      if (uVar28 == 0) {
        uVar22 = 0;
      }
      else {
        uVar22 = 0x1f;
        if (uVar28 < 0x10000) {
          uVar22 = 0x1f;
          if (uVar28 != 0) {
            for (; uVar28 >> uVar22 == 0; uVar22 = uVar22 - 1) {
            }
          }
          uVar22 = (uint)(((ulong)oldbase >> ((ulong)(byte)(0x26 - (char)(uVar22 ^ 0x1f)) & 0x3f) &
                          1) != 0) + (uVar22 ^ 0x1f) * 2 ^ 0x3e;
        }
      }
      uVar24 = -(long)oldbase;
      pmVar41 = _gm_.treebins[uVar22];
      __size = 0;
      if (pmVar41 == (tbinptr)0x0) {
        pmVar41 = (tbinptr)0x0;
      }
      else {
        bVar36 = 0x39 - (char)(uVar22 >> 1);
        if (uVar22 == 0x1f) {
          bVar36 = 0;
        }
        lVar35 = (long)oldbase << (bVar36 & 0x3f);
        pmVar23 = (tbinptr)0x0;
        do {
          uVar37 = (pmVar41->head & 0xfffffffffffffff8) - (long)oldbase;
          if ((uVar37 < uVar24) && (uVar24 = uVar37, __size = (size_t)pmVar41, uVar37 == 0)) {
            bVar44 = false;
            uVar24 = 0;
          }
          else {
            pmVar8 = pmVar41->child[1];
            pmVar41 = *(tbinptr *)((long)pmVar41 + (4 - (lVar35 >> 0x3f)) * 8);
            pmVar38 = pmVar8;
            if (pmVar8 == pmVar41) {
              pmVar38 = pmVar23;
            }
            if (pmVar8 != (tbinptr)0x0) {
              pmVar23 = pmVar38;
            }
            if (pmVar41 == (tbinptr)0x0) {
              bVar44 = false;
              pmVar41 = pmVar23;
            }
            else {
              lVar35 = lVar35 * 2;
              bVar44 = true;
            }
          }
        } while (bVar44);
      }
      if (pmVar41 == (tbinptr)0x0 && (tbinptr)__size == (tbinptr)0x0) {
        uVar28 = 2 << ((byte)uVar22 & 0x1f);
        uVar28 = (-uVar28 | uVar28) & _gm_.treemap;
        if (uVar28 == 0) {
          pmVar41 = (tbinptr)0x0;
        }
        else {
          uVar22 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          pmVar41 = _gm_.treebins[uVar22];
        }
      }
      while (pmVar23 = pmVar41, pmVar23 != (tbinptr)0x0) {
        uVar15 = (pmVar23->head & 0xfffffffffffffff8) - (long)oldbase;
        uVar37 = uVar15;
        if (uVar24 <= uVar15) {
          uVar37 = uVar24;
        }
        if (uVar24 > uVar15) {
          __size = (size_t)pmVar23;
        }
        uVar24 = uVar37;
        pmVar41 = pmVar23->child[0];
        if (pmVar23->child[0] == (malloc_tree_chunk *)0x0) {
          pmVar41 = pmVar23->child[1];
        }
      }
      if (((tbinptr)__size != (tbinptr)0x0) && (uVar24 < _gm_.dvsize - (long)oldbase)) {
        if (__size < _gm_.least_addr) goto LAB_0010510e;
        if (0 < (long)oldbase) {
          pmVar41 = ((tbinptr)__size)->bk;
          pmVar32 = ((tbinptr)__size)->parent;
          if (pmVar41 == (tbinptr)__size) {
            pmVar41 = ((tbinptr)__size)->child[1];
            if (pmVar41 != (tbinptr)0x0) {
              ppmVar25 = ((tbinptr)__size)->child + 1;
LAB_0010462b:
              do {
                if (pmVar41->child[1] == (malloc_tree_chunk *)0x0) {
                  if (pmVar41->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x0010463f;
                  ppmVar25 = pmVar41->child;
                }
                else {
                  ppmVar25 = pmVar41->child + 1;
                }
                pmVar41 = *ppmVar25;
              } while( true );
            }
            pmVar41 = ((tbinptr)__size)->child[0];
            if (pmVar41 != (tbinptr)0x0) {
              ppmVar25 = ((tbinptr)__size)->child;
              goto LAB_0010462b;
            }
            pmVar41 = (tbinptr)0x0;
          }
          else {
            pmVar5 = ((tbinptr)__size)->fd;
            if (((pmVar5 < _gm_.least_addr) || (pmVar5->bk != (malloc_tree_chunk *)__size)) ||
               (pmVar41->fd != (malloc_tree_chunk *)__size)) goto LAB_0010510e;
            pmVar5->bk = pmVar41;
            pmVar41->fd = pmVar5;
          }
          goto LAB_0010464f;
        }
        goto LAB_001048d0;
      }
      __size = 0;
      goto LAB_001048d9;
    }
  }
LAB_0010401e:
  pmVar17 = _gm_.dv;
  sVar9 = _gm_.dvsize;
  uVar24 = _gm_.dvsize - (long)oldbase;
  if (_gm_.dvsize < oldbase) {
    uVar24 = _gm_.topsize - (long)oldbase;
    if (_gm_.topsize < oldbase || uVar24 == 0) {
      if (mparams.magic == 0) {
        init_mparams();
      }
      pmVar41 = (tbinptr)__size;
      if (((((byte)_gm_.mflags & 1) != 0) && (mparams.mmap_threshold <= oldbase)) &&
         (_gm_.topsize != 0)) {
        pcVar42 = (char *)(-mparams.page_size & (ulong)(oldbase + mparams.page_size + 0x3e));
        if (((_gm_.footprint_limit == 0) ||
            (pcVar42 + _gm_.footprint <= _gm_.footprint_limit &&
             _gm_.footprint < pcVar42 + _gm_.footprint)) && (oldbase < pcVar42)) {
          if (dev_zero_fd < 0) {
            dev_zero_fd = open("/dev/zero",2);
          }
          pmVar41 = (tbinptr)0x0;
          pcVar14 = (char *)mmap((void *)0x0,(size_t)pcVar42,3,2,dev_zero_fd,0);
          if (pcVar14 != (char *)0xffffffffffffffff) {
            uVar24 = (ulong)(-(int)pcVar14 - 0x10U & 0xf);
            *(ulong *)(pcVar14 + uVar24) = uVar24;
            *(char **)(pcVar14 + uVar24 + 8) = pcVar42 + (-0x20 - uVar24);
            pcVar43 = pcVar14 + (long)(pcVar42 + -0x18);
            pcVar43[0] = '\v';
            pcVar43[1] = '\0';
            pcVar43[2] = '\0';
            pcVar43[3] = '\0';
            pcVar43[4] = '\0';
            pcVar43[5] = '\0';
            pcVar43[6] = '\0';
            pcVar43[7] = '\0';
            pcVar43 = pcVar14 + -0x10 + (long)pcVar42;
            pcVar43[0] = '\0';
            pcVar43[1] = '\0';
            pcVar43[2] = '\0';
            pcVar43[3] = '\0';
            pcVar43[4] = '\0';
            pcVar43[5] = '\0';
            pcVar43[6] = '\0';
            pcVar43[7] = '\0';
            if ((_gm_.least_addr == (char *)0x0) || (pcVar14 < _gm_.least_addr)) {
              _gm_.least_addr = pcVar14;
            }
            _gm_.footprint = (size_t)(pcVar42 + _gm_.footprint);
            if (_gm_.max_footprint < _gm_.footprint) {
              _gm_.max_footprint = _gm_.footprint;
            }
            pmVar41 = (tbinptr)(pcVar14 + uVar24 + 0x10);
          }
          if (pcVar14 == (char *)0xffffffffffffffff) goto LAB_001041d8;
        }
        else {
LAB_001041d8:
          pmVar41 = (tbinptr)0x0;
        }
        __size = (size_t)pmVar41;
        if (pmVar41 != (tbinptr)0x0) goto LAB_001042e8;
      }
      iVar12 = malloc_global_mutex;
      pcVar42 = (char *)(-mparams.granularity & (ulong)(oldbase + mparams.granularity + 0x5f));
      if (oldbase < pcVar42) {
        if ((_gm_.footprint_limit != 0) &&
           (__size = 0,
           _gm_.footprint_limit < pcVar42 + _gm_.footprint ||
           pcVar42 + _gm_.footprint <= _gm_.footprint)) goto LAB_001042e8;
        if (((byte)_gm_.mflags & 4) == 0) {
          if (_gm_.top != (mchunkptr)0x0) {
            pmVar26 = &_gm_.seg;
            do {
              if (((mchunkptr)pmVar26->base <= _gm_.top) &&
                 (_gm_.top <
                  (mchunkptr)((long)&((mchunkptr)pmVar26->base)->prev_foot + pmVar26->size)))
              goto LAB_00104280;
              pmVar26 = pmVar26->next;
            } while (pmVar26 != (malloc_segment *)0x0);
          }
          pmVar26 = (malloc_segment *)0x0;
LAB_00104280:
          uVar28 = 1;
          LOCK();
          malloc_global_mutex = 1;
          UNLOCK();
          if (iVar12 != 0) {
            while (malloc_global_mutex != 0) {
              if ((uVar28 & 0x3f) == 0) {
                sched_yield();
              }
              uVar28 = uVar28 + 1;
            }
            LOCK();
            UNLOCK();
          }
          malloc_global_mutex = 1;
          if (pmVar26 == (malloc_segment *)0x0) {
            pmVar19 = (mstate)sbrk(0);
            pmVar16 = (mstate)0xffffffffffffffff;
            pcVar43 = pcVar42;
            if (pmVar19 != (mstate)0xffffffffffffffff) {
              if ((mparams.page_size - 1 & (ulong)pmVar19) != 0) {
                pcVar43 = pcVar42 + ((-mparams.page_size &
                                     (long)pmVar19->smallbins + (mparams.page_size - 0x49)) -
                                    (long)pmVar19);
              }
              if ((pcVar43 < (char *)0x7fffffffffffffff && oldbase < pcVar43) &&
                 ((_gm_.footprint_limit == 0 ||
                  (pcVar43 + _gm_.footprint <= _gm_.footprint_limit &&
                   _gm_.footprint < pcVar43 + _gm_.footprint)))) {
                pmVar16 = (mstate)sbrk((intptr_t)pcVar43);
                pcVar40 = (char *)0x0;
                if (pmVar16 == pmVar19) {
                  pcVar40 = pcVar43;
                }
                m = (mstate)0xffffffffffffffff;
                if (pmVar16 == pmVar19) {
                  m = pmVar19;
                }
                goto LAB_00104aaf;
              }
            }
            pcVar40 = (char *)0x0;
            m = (mstate)0xffffffffffffffff;
          }
          else {
            pcVar43 = (char *)(-mparams.granularity &
                              (ulong)(oldbase + mparams.granularity + (0x5f - _gm_.topsize)));
            if (pcVar43 < (char *)0x7fffffffffffffff) {
              pmVar16 = (mstate)sbrk((intptr_t)pcVar43);
              bVar44 = pmVar16 == (mstate)(pmVar26->base + pmVar26->size);
              pcVar40 = (char *)0x0;
              if (bVar44) {
                pcVar40 = pcVar43;
              }
              m = (mstate)0xffffffffffffffff;
              if (bVar44) {
                m = pmVar16;
              }
            }
            else {
              pmVar16 = (mstate)0xffffffffffffffff;
              pcVar40 = (char *)0x0;
              m = (mstate)0xffffffffffffffff;
            }
          }
LAB_00104aaf:
          pcVar14 = pcVar40;
          if (m == (mstate)0xffffffffffffffff) {
            m = pmVar16;
            if ((((pcVar43 < oldbase + 0x60) && (pcVar43 < (char *)0x7fffffffffffffff)) &&
                (pmVar16 != (mstate)0xffffffffffffffff)) &&
               (uVar24 = -mparams.granularity &
                         (ulong)(oldbase + mparams.granularity + (0x5f - (long)pcVar43)),
               uVar24 < 0x7fffffffffffffff)) {
              pvVar18 = sbrk(uVar24);
              if (pvVar18 == (void *)0xffffffffffffffff) {
                sbrk(-(long)pcVar43);
                m = (mstate)0xffffffffffffffff;
              }
              else {
                pcVar43 = pcVar43 + uVar24;
              }
            }
            pcVar14 = pcVar43;
            if (m == (mstate)0xffffffffffffffff) {
              _gm_.mflags._0_1_ = (byte)_gm_.mflags | 4;
              m = (mstate)0xffffffffffffffff;
              pcVar14 = pcVar40;
            }
          }
          malloc_global_mutex = 0;
        }
        else {
          m = (mstate)0xffffffffffffffff;
          pcVar14 = (char *)0x0;
        }
        fVar39 = 0;
        if (m == (mstate)0xffffffffffffffff) {
          if (dev_zero_fd < 0) {
            dev_zero_fd = open("/dev/zero",2);
          }
          m = (mstate)mmap((void *)0x0,(size_t)pcVar42,3,2,dev_zero_fd,0);
          fVar39 = (flag_t)(m != (mstate)0xffffffffffffffff);
          if (m != (mstate)0xffffffffffffffff) {
            pcVar14 = pcVar42;
          }
        }
        iVar12 = malloc_global_mutex;
        if ((pcVar42 < (char *)0x7fffffffffffffff) && (m == (mstate)0xffffffffffffffff)) {
          uVar28 = 1;
          LOCK();
          malloc_global_mutex = 1;
          UNLOCK();
          if (iVar12 != 0) {
            while (malloc_global_mutex != 0) {
              if ((uVar28 & 0x3f) == 0) {
                sched_yield();
              }
              uVar28 = uVar28 + 1;
            }
            LOCK();
            UNLOCK();
          }
          malloc_global_mutex = 1;
          pmVar19 = (mstate)sbrk((intptr_t)pcVar42);
          pmVar16 = (mstate)sbrk(0);
          malloc_global_mutex = 0;
          m = (mstate)0xffffffffffffffff;
          if (pmVar19 < pmVar16 &&
              (pmVar16 != (mstate)0xffffffffffffffff && pmVar19 != (mstate)0xffffffffffffffff)) {
            pcVar42 = (char *)((long)pmVar16 - (long)pmVar19);
            if (oldbase + 0x50 < pcVar42) {
              pcVar14 = pcVar42;
            }
            m = (mstate)0xffffffffffffffff;
            if (oldbase + 0x50 < pcVar42) {
              m = pmVar19;
            }
          }
        }
        pmVar17 = _gm_.top;
        if (m != (mstate)0xffffffffffffffff) {
          _gm_.footprint = (size_t)(pcVar14 + _gm_.footprint);
          if (_gm_.max_footprint < _gm_.footprint) {
            _gm_.max_footprint = _gm_.footprint;
          }
          if (_gm_.top == (mchunkptr)0x0) {
            if ((_gm_.least_addr == (char *)0x0) || (m < _gm_.least_addr)) {
              _gm_.least_addr = (char *)m;
            }
            _gm_.magic = mparams.magic;
            _gm_.release_checks = 0xfff;
            lVar35 = 0x20;
            lVar27 = 0x10ed50;
            _gm_.seg.base = (char *)m;
            _gm_.seg.size = (size_t)pcVar14;
            _gm_.seg.sflags = fVar39;
            do {
              *(long *)(lVar27 + 0x18) = lVar27;
              *(long *)(lVar27 + 0x10) = lVar27;
              lVar27 = lVar27 + 0x10;
              lVar35 = lVar35 + -1;
            } while (lVar35 != 0);
            uVar24 = (ulong)(-(int)m - 0x10U & 0xf);
            _gm_.top = (mchunkptr)((long)m->smallbins + (uVar24 - 0x48));
            _gm_.topsize = (size_t)(pcVar14 + (-0x50 - uVar24));
            *(size_t *)((long)m->smallbins + (uVar24 - 0x40)) = _gm_.topsize | 1;
            pcVar14 = (char *)((long)&m[-1].max_footprint + (long)pcVar14);
            pcVar14[0] = 'P';
            pcVar14[1] = '\0';
            pcVar14[2] = '\0';
            pcVar14[3] = '\0';
            pcVar14[4] = '\0';
            pcVar14[5] = '\0';
            pcVar14[6] = '\0';
            pcVar14[7] = '\0';
            _gm_.trim_check = mparams.trim_threshold;
          }
          else {
            pmVar26 = &_gm_.seg;
            do {
              pmVar19 = (mstate)((long)&((mchunkptr)pmVar26->base)->prev_foot + pmVar26->size);
              if (m == pmVar19) {
                if ((((_gm_.top < pmVar19) && ((mchunkptr)pmVar26->base <= _gm_.top)) &&
                    ((pmVar26->sflags & 8) == 0)) && ((pmVar26->sflags & 1) == fVar39)) {
                  pmVar26->size = (size_t)(pcVar14 + pmVar26->size);
                  pcVar14 = pcVar14 + _gm_.topsize;
                  uVar24 = (ulong)(-(int)_gm_.top - 0x10U & 0xf);
                  _gm_.topsize = (long)pcVar14 - uVar24;
                  psVar3 = &(_gm_.top)->head;
                  _gm_.top = (mchunkptr)((long)&(_gm_.top)->prev_foot + uVar24);
                  *(size_t *)((long)psVar3 + uVar24) = _gm_.topsize | 1;
                  pcVar14 = (char *)((long)&pmVar17->head + (long)pcVar14);
                  pcVar14[0] = 'P';
                  pcVar14[1] = '\0';
                  pcVar14[2] = '\0';
                  pcVar14[3] = '\0';
                  pcVar14[4] = '\0';
                  pcVar14[5] = '\0';
                  pcVar14[6] = '\0';
                  pcVar14[7] = '\0';
                  _gm_.trim_check = mparams.trim_threshold;
                  bVar44 = true;
                  goto LAB_001050e2;
                }
                break;
              }
              pmVar26 = pmVar26->next;
            } while (pmVar26 != (malloc_segment *)0x0);
            if (m < _gm_.least_addr) {
              _gm_.least_addr = (char *)m;
            }
            pmVar26 = &_gm_.seg;
            do {
              pcVar42 = pmVar26->base;
              if (pcVar42 == pcVar14 + (long)(m->smallbins + -9)) {
                if (((pmVar26->sflags & 8) == 0) && ((pmVar26->sflags & 1) == fVar39)) {
                  pmVar26->base = (char *)m;
                  pmVar26->size = (size_t)(pcVar14 + pmVar26->size);
                  pmVar41 = (tbinptr)prepend_alloc(m,pcVar42,oldbase,(size_t)pmVar26);
                  bVar44 = false;
                  goto LAB_001050e2;
                }
                break;
              }
              pmVar26 = pmVar26->next;
            } while (pmVar26 != (malloc_segment *)0x0);
            for (pmVar26 = &_gm_.seg;
                (_gm_.top < (mchunkptr)pmVar26->base ||
                (pmVar20 = (mchunkptr)((long)&((mchunkptr)pmVar26->base)->prev_foot + pmVar26->size)
                , pmVar20 <= _gm_.top)); pmVar26 = pmVar26->next) {
            }
            pmVar33 = (mchunkptr)((long)pmVar20 + ((ulong)(0x4fU - (int)pmVar20 & 0xf) - 0x5f));
            pmVar1 = _gm_.top + 1;
            if (pmVar33 < pmVar1) {
              pmVar33 = _gm_.top;
            }
            uVar24 = (ulong)(-(int)m - 0x10U & 0xf);
            _gm_.top = (mchunkptr)((long)m->smallbins + (uVar24 - 0x48));
            _gm_.topsize = (size_t)(pcVar14 + (-0x50 - uVar24));
            *(size_t *)((long)m->smallbins + (uVar24 - 0x40)) = _gm_.topsize | 1;
            pcVar42 = (char *)((long)&m[-1].max_footprint + (long)pcVar14);
            pcVar42[0] = 'P';
            pcVar42[1] = '\0';
            pcVar42[2] = '\0';
            pcVar42[3] = '\0';
            pcVar42[4] = '\0';
            pcVar42[5] = '\0';
            pcVar42[6] = '\0';
            pcVar42[7] = '\0';
            _gm_.trim_check = mparams.trim_threshold;
            pmVar33->head = 0x33;
            sVar9 = CONCAT44(_gm_.seg._28_4_,_gm_.seg.sflags);
            pmVar33[1].prev_foot = (size_t)_gm_.seg.next;
            pmVar33[1].head = sVar9;
            pmVar33->fd = (malloc_chunk *)_gm_.seg.base;
            pmVar33->bk = (malloc_chunk *)_gm_.seg.size;
            ppmVar30 = &pmVar33[1].fd;
            _gm_.seg.base = (char *)m;
            _gm_.seg.size = (size_t)pcVar14;
            _gm_.seg.next = (malloc_segment *)&pmVar33->fd;
            _gm_.seg.sflags = fVar39;
            do {
              ppmVar30[1] = (malloc_chunk *)0xb;
              pmVar2 = (mchunkptr)(ppmVar30 + 2);
              ppmVar30 = ppmVar30 + 1;
            } while (pmVar2 < pmVar20);
            bVar44 = true;
            uVar24 = (long)pmVar33 - (long)pmVar17;
            if (uVar24 != 0) {
              *(byte *)&pmVar33->head = (byte)pmVar33->head & 0xfe;
              pmVar17->head = uVar24 | 1;
              pmVar33->prev_foot = uVar24;
              if (uVar24 < 0x100) {
                uVar24 = uVar24 >> 3;
                if ((_gm_.smallmap >> ((uint)uVar24 & 0x1f) & 1) == 0) {
                  _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar24 & 0x1f);
                  pmVar20 = (mchunkptr)(_gm_.smallbins + uVar24 * 2);
                }
                else {
                  pmVar20 = _gm_.smallbins[uVar24 * 2 + 2];
                  if (_gm_.smallbins[uVar24 * 2 + 2] < _gm_.least_addr) {
LAB_0010510e:
                    abort();
                  }
                }
                _gm_.smallbins[uVar24 * 2 + 2] = pmVar17;
                pmVar20->bk = pmVar17;
                pmVar17->fd = pmVar20;
                pmVar17->bk = (mchunkptr)(_gm_.smallbins + uVar24 * 2);
              }
              else {
                uVar28 = (uint)(uVar24 >> 8);
                if (uVar28 == 0) {
                  uVar22 = 0;
                }
                else {
                  uVar22 = 0x1f;
                  if (uVar28 < 0x10000) {
                    uVar22 = 0x1f;
                    if (uVar28 != 0) {
                      for (; uVar28 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                      }
                    }
                    uVar22 = (uint)((uVar24 >> ((ulong)(byte)(0x26 - (char)(uVar22 ^ 0x1f)) & 0x3f)
                                    & 1) != 0) + (uVar22 ^ 0x1f) * 2 ^ 0x3e;
                  }
                }
                pmVar34 = (malloc_chunk *)(_gm_.treebins + uVar22);
                *(uint *)&pmVar17[1].bk = uVar22;
                pmVar1->prev_foot = 0;
                pmVar17[1].head = 0;
                if ((_gm_.treemap >> (uVar22 & 0x1f) & 1) == 0) {
                  _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar22 & 0x1f);
                  pmVar34->prev_foot = (size_t)pmVar17;
                  pmVar17[1].fd = pmVar34;
                  pmVar17->bk = pmVar17;
                  pmVar17->fd = pmVar17;
                }
                else {
                  pmVar23 = (tbinptr)pmVar34->prev_foot;
                  bVar36 = 0x39 - (char)(uVar22 >> 1);
                  if (uVar22 == 0x1f) {
                    bVar36 = 0;
                  }
                  lVar35 = uVar24 << (bVar36 & 0x3f);
                  do {
                    if ((pmVar23->head & 0xfffffffffffffff8) == uVar24) {
                      if ((pmVar23 < _gm_.least_addr) ||
                         (pmVar32 = pmVar23->fd, pmVar32 < _gm_.least_addr)) goto LAB_0010510e;
                      pmVar32->bk = (malloc_tree_chunk *)pmVar17;
                      pmVar23->fd = (malloc_tree_chunk *)pmVar17;
                      pmVar17->fd = (malloc_chunk *)pmVar32;
                      pmVar17->bk = (malloc_chunk *)pmVar23;
                      pmVar17[1].fd = (malloc_chunk *)0x0;
                      break;
                    }
                    pmVar8 = *(tbinptr *)((long)pmVar23 + (lVar35 >> 0x3f) * -8 + 0x20);
                    pmVar38 = pmVar8;
                    if (pmVar8 == (tbinptr)0x0) {
                      pcVar42 = (char *)((long)pmVar23 + (lVar35 >> 0x3f) * -8 + 0x20);
                      if (pcVar42 < _gm_.least_addr) goto LAB_0010510e;
                      *(mchunkptr *)pcVar42 = pmVar17;
                      pmVar17[1].fd = (malloc_chunk *)pmVar23;
                      pmVar17->bk = pmVar17;
                      pmVar17->fd = pmVar17;
                      pmVar38 = pmVar23;
                    }
                    pmVar23 = pmVar38;
                    lVar35 = lVar35 * 2;
                  } while (pmVar8 != (tbinptr)0x0);
                }
              }
            }
LAB_001050e2:
            __size = (size_t)pmVar41;
            if (!bVar44) goto LAB_001042e8;
          }
          uVar24 = _gm_.topsize - (long)oldbase;
          if (oldbase <= _gm_.topsize && uVar24 != 0) goto LAB_00104039;
        }
        piVar21 = _PDCLIB_errno_func();
        *piVar21 = 0xc;
      }
      __size = 0;
      goto LAB_001042e8;
    }
LAB_00104039:
    pmVar17 = _gm_.top;
    psVar3 = &(_gm_.top)->head;
    _gm_.topsize = uVar24;
    _gm_.top = (mchunkptr)(oldbase + (long)&(_gm_.top)->prev_foot);
    *(ulong *)((long)psVar3 + (long)oldbase) = uVar24 | 1;
LAB_00104090:
    pmVar17->head = (ulong)oldbase | 3;
  }
  else {
    if (0x1f < uVar24) {
      psVar3 = &(_gm_.dv)->head;
      _gm_.dvsize = uVar24;
      _gm_.dv = (mchunkptr)(oldbase + (long)&(_gm_.dv)->prev_foot);
      *(ulong *)((long)psVar3 + (long)oldbase) = uVar24 | 1;
      *(ulong *)((long)&pmVar17->prev_foot + sVar9) = uVar24;
      goto LAB_00104090;
    }
    _gm_.dvsize = 0;
    _gm_.dv = (mchunkptr)0x0;
    pmVar17->head = sVar9 | 3;
    pbVar4 = (byte *)((long)&pmVar17->head + sVar9);
    *pbVar4 = *pbVar4 | 1;
  }
  __size = (size_t)&pmVar17->fd;
LAB_001042e8:
  if (((byte)_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return (tbinptr)__size;
code_r0x00104918:
  if (ppmVar25 < _gm_.least_addr) goto LAB_0010510e;
  *ppmVar25 = (malloc_tree_chunk *)0x0;
LAB_00104928:
  if (pmVar5 != (malloc_tree_chunk *)0x0) {
    uVar28 = pmVar23->index;
    if (pmVar23 == _gm_.treebins[uVar28]) {
      _gm_.treebins[uVar28] = pmVar32;
      if (pmVar32 == (malloc_tree_chunk *)0x0) {
        _gm_.treemap = bVar11 & ~(1 << (uVar28 & 0x1f));
        goto LAB_00104975;
      }
    }
    else {
      if (pmVar5 < _gm_.least_addr) goto LAB_0010510e;
      if (pmVar5->child[0] == pmVar23) {
        pmVar5->child[0] = pmVar32;
      }
      else {
        pmVar5->child[1] = pmVar32;
      }
LAB_00104975:
      if (pmVar32 == (malloc_tree_chunk *)0x0) goto LAB_001049c2;
    }
    pcVar42 = _gm_.least_addr;
    if (pmVar32 < _gm_.least_addr) goto LAB_0010510e;
    pmVar32->parent = pmVar5;
    pmVar5 = pmVar23->child[0];
    if (pmVar5 != (malloc_tree_chunk *)0x0) {
      if (pmVar5 < pcVar42) goto LAB_0010510e;
      pmVar32->child[0] = pmVar5;
      pmVar5->parent = pmVar32;
    }
    pmVar5 = pmVar23->child[1];
    if (pmVar5 != (malloc_tree_chunk *)0x0) {
      if (pmVar5 < pcVar42) goto LAB_0010510e;
      pmVar32->child[1] = pmVar5;
      pmVar5->parent = pmVar32;
    }
  }
LAB_001049c2:
  if (uVar24 < 0x20) {
    pmVar23->head = (ulong)(oldbase + uVar24) | 3;
    pbVar4 = (byte *)((long)&pmVar23->head + (long)(oldbase + uVar24));
    *pbVar4 = *pbVar4 | 1;
    uVar24 = _gm_.dvsize;
    pmVar17 = _gm_.dv;
  }
  else {
    pmVar17 = (mchunkptr)(oldbase + (long)(pmVar23->child + -4));
    pmVar23->head = (ulong)oldbase | 3;
    *(ulong *)((long)&pmVar23->head + (long)oldbase) = uVar24 | 1;
    *(ulong *)((long)&pmVar17->prev_foot + uVar24) = uVar24;
    if (sVar9 != 0) {
      uVar28 = (uint)(sVar9 >> 3);
      uVar37 = (ulong)(uVar28 * 2);
      if ((bVar10 >> (uVar28 & 0x1f) & 1) == 0) {
        _gm_.smallmap = 1 << ((byte)(sVar9 >> 3) & 0x1f) | bVar10;
        pmVar20 = (mchunkptr)(_gm_.smallbins + uVar37);
      }
      else {
        pmVar20 = _gm_.smallbins[uVar37 + 2];
        if (_gm_.smallbins[uVar37 + 2] < _gm_.least_addr) goto LAB_0010510e;
      }
      _gm_.smallbins[uVar37 + 2] = _gm_.dv;
      pmVar20->bk = _gm_.dv;
      (_gm_.dv)->fd = pmVar20;
      (_gm_.dv)->bk = (mchunkptr)(_gm_.smallbins + uVar37);
    }
  }
  _gm_.dv = pmVar17;
  _gm_.dvsize = uVar24;
  __size = (size_t)&pmVar23->fd;
LAB_00103ed7:
  bVar44 = false;
LAB_00104015:
  if (!bVar44) goto LAB_001042e8;
  goto LAB_0010401e;
code_r0x0010463f:
  if (ppmVar25 < _gm_.least_addr) goto LAB_0010510e;
  *ppmVar25 = (malloc_tree_chunk *)0x0;
LAB_0010464f:
  if (pmVar32 != (malloc_tree_chunk *)0x0) {
    uVar28 = ((tbinptr)__size)->index;
    if ((tbinptr)__size == _gm_.treebins[uVar28]) {
      _gm_.treebins[uVar28] = pmVar41;
      if (pmVar41 == (tbinptr)0x0) {
        _gm_.treemap = bVar11 & ~(1 << (uVar28 & 0x1f));
        goto LAB_0010469c;
      }
    }
    else {
      if (pmVar32 < _gm_.least_addr) goto LAB_0010510e;
      if (pmVar32->child[0] == (malloc_tree_chunk *)__size) {
        pmVar32->child[0] = pmVar41;
      }
      else {
        pmVar32->child[1] = pmVar41;
      }
LAB_0010469c:
      if (pmVar41 == (tbinptr)0x0) goto LAB_001046e9;
    }
    pcVar42 = _gm_.least_addr;
    if (pmVar41 < _gm_.least_addr) goto LAB_0010510e;
    pmVar41->parent = pmVar32;
    pmVar32 = ((tbinptr)__size)->child[0];
    if (pmVar32 != (malloc_tree_chunk *)0x0) {
      if (pmVar32 < pcVar42) goto LAB_0010510e;
      pmVar41->child[0] = pmVar32;
      pmVar32->parent = pmVar41;
    }
    pmVar32 = ((tbinptr)__size)->child[1];
    if (pmVar32 != (malloc_tree_chunk *)0x0) {
      if (pmVar32 < pcVar42) goto LAB_0010510e;
      pmVar41->child[1] = pmVar32;
      pmVar32->parent = pmVar41;
    }
  }
LAB_001046e9:
  if (uVar24 < 0x20) {
    ((tbinptr)__size)->head = (ulong)(oldbase + uVar24) | 3;
    pbVar4 = (byte *)((long)&((tbinptr)__size)->head + (long)(oldbase + uVar24));
    *pbVar4 = *pbVar4 | 1;
  }
  else {
    pmVar34 = (malloc_chunk *)(oldbase + (long)&((tbinptr)__size)->prev_foot);
    ((tbinptr)__size)->head = (ulong)oldbase | 3;
    *(ulong *)((long)&((tbinptr)__size)->head + (long)oldbase) = uVar24 | 1;
    *(ulong *)((long)&pmVar34->prev_foot + uVar24) = uVar24;
    if (uVar24 < 0x100) {
      uVar24 = uVar24 >> 3;
      if ((_gm_.smallmap >> ((uint)uVar24 & 0x1f) & 1) == 0) {
        _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar24 & 0x1f);
        pmVar17 = (malloc_chunk *)(_gm_.smallbins + uVar24 * 2);
      }
      else {
        pmVar17 = _gm_.smallbins[uVar24 * 2 + 2];
        if (_gm_.smallbins[uVar24 * 2 + 2] < _gm_.least_addr) goto LAB_0010510e;
      }
      _gm_.smallbins[uVar24 * 2 + 2] = pmVar34;
      pmVar17->bk = pmVar34;
      pmVar34->fd = pmVar17;
      pmVar34->bk = (malloc_chunk *)(_gm_.smallbins + uVar24 * 2);
    }
    else {
      uVar28 = (uint)(uVar24 >> 8);
      if (uVar28 == 0) {
        uVar22 = 0;
      }
      else {
        uVar22 = 0x1f;
        if (uVar28 < 0x10000) {
          uVar22 = 0x1f;
          if (uVar28 != 0) {
            for (; uVar28 >> uVar22 == 0; uVar22 = uVar22 - 1) {
            }
          }
          uVar22 = (uint)((uVar24 >> ((ulong)(byte)(0x26 - (char)(uVar22 ^ 0x1f)) & 0x3f) & 1) != 0)
                   + (uVar22 ^ 0x1f) * 2 ^ 0x3e;
        }
      }
      pmVar29 = (malloc_chunk *)(_gm_.treebins + uVar22);
      *(uint *)&pmVar34[1].bk = uVar22;
      pmVar34[1].prev_foot = 0;
      pmVar34[1].head = 0;
      if ((_gm_.treemap >> (uVar22 & 0x1f) & 1) == 0) {
        _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar22 & 0x1f);
        pmVar29->prev_foot = (size_t)pmVar34;
        pmVar34[1].fd = pmVar29;
        pmVar34->bk = pmVar34;
        pmVar34->fd = pmVar34;
      }
      else {
        pmVar29 = (malloc_chunk *)pmVar29->prev_foot;
        bVar36 = 0x39 - (char)(uVar22 >> 1);
        if (uVar22 == 0x1f) {
          bVar36 = 0;
        }
        lVar35 = uVar24 << (bVar36 & 0x3f);
        do {
          if ((pmVar29->head & 0xfffffffffffffff8) == uVar24) {
            if ((pmVar29 < _gm_.least_addr) || (pmVar7 = pmVar29->fd, pmVar7 < _gm_.least_addr))
            goto LAB_0010510e;
            pmVar7->bk = pmVar34;
            pmVar29->fd = pmVar34;
            pmVar34->fd = pmVar7;
            pmVar34->bk = pmVar29;
            pmVar34[1].fd = (malloc_chunk *)0x0;
            break;
          }
          pmVar7 = *(malloc_chunk **)((long)pmVar29 + (lVar35 >> 0x3f) * -8 + 0x20);
          pmVar13 = pmVar7;
          if (pmVar7 == (malloc_chunk *)0x0) {
            plVar31 = (long *)((long)pmVar29 + (lVar35 >> 0x3f) * -8 + 0x20);
            if (plVar31 < _gm_.least_addr) goto LAB_0010510e;
            *plVar31 = (long)pmVar34;
            pmVar34[1].fd = pmVar29;
            pmVar34->bk = pmVar34;
            pmVar34->fd = pmVar34;
            pmVar13 = pmVar29;
          }
          pmVar29 = pmVar13;
          lVar35 = lVar35 * 2;
        } while (pmVar7 != (malloc_chunk *)0x0);
      }
    }
  }
  __size = (size_t)&((tbinptr)__size)->fd;
LAB_001048d0:
  if ((long)oldbase < 1) goto LAB_0010510e;
LAB_001048d9:
  if ((tbinptr)__size != (tbinptr)0x0) goto LAB_001042e8;
  goto LAB_0010401e;
}

Assistant:

void* dlmalloc(size_t bytes) {
  /*
     Basic algorithm:
     If a small request (< 256 bytes minus per-chunk overhead):
       1. If one exists, use a remainderless chunk in associated smallbin.
          (Remainderless means that there are too few excess bytes to
          represent as a chunk.)
       2. If it is big enough, use the dv chunk, which is normally the
          chunk adjacent to the one used for the most recent small request.
       3. If one exists, split the smallest available chunk in a bin,
          saving remainder in dv.
       4. If it is big enough, use the top chunk.
       5. If available, get memory from system and use it
     Otherwise, for a large request:
       1. Find the smallest available binned chunk that fits, and use it
          if it is better fitting than dv chunk, splitting if necessary.
       2. If better fitting than any binned chunk, use the dv chunk.
       3. If it is big enough, use the top chunk.
       4. If request size >= mmap threshold, try to directly mmap this chunk.
       5. If available, get memory from system and use it

     The ugly goto's here ensure that postaction occurs along all paths.
  */

#if USE_LOCKS
  ensure_initialization(); /* initialize in sys_alloc if not using locks */
#endif

  if (!PREACTION(gm)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = gm->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(gm, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(gm, b, p, idx);
        set_inuse_and_pinuse(gm, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }

      else if (nb > gm->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(gm, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(gm, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(gm, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(gm, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }

        else if (gm->treemap != 0 && (mem = tmalloc_small(gm, nb)) != 0) {
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (gm->treemap != 0 && (mem = tmalloc_large(gm, nb)) != 0) {
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }
    }

    if (nb <= gm->dvsize) {
      size_t rsize = gm->dvsize - nb;
      mchunkptr p = gm->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = gm->dv = chunk_plus_offset(p, nb);
        gm->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = gm->dvsize;
        gm->dvsize = 0;
        gm->dv = 0;
        set_inuse_and_pinuse(gm, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    else if (nb < gm->topsize) { /* Split top */
      size_t rsize = gm->topsize -= nb;
      mchunkptr p = gm->top;
      mchunkptr r = gm->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(gm, gm->top);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(gm, nb);

  postaction:
    POSTACTION(gm);
    return mem;
  }

  return 0;
}